

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall
CVmObjDict::enum_word_props
          (CVmObjDict *this,_func_void_void_ptr_vm_prop_id_t_vm_val_t_ptr *cb_func,void *cb_ctx,
          vm_val_t *strval,char *strp,size_t strl)

{
  _func_void_void_ptr_CVmHashEntry_ptr *in_RCX;
  void *in_RSI;
  CVmObjDict *in_RDI;
  undefined8 in_R8;
  CVmHashTable *in_R9;
  uint hash;
  enum_word_props_ctx ctx;
  uint hash_00;
  
  hash_00 = (uint)((ulong)in_R8 >> 0x20);
  calc_str_hash((CVmObjDict *)ctx.strl,(vm_val_t *)ctx.strp,(char *)ctx.strval,(size_t)ctx.cb_func);
  get_ext(in_RDI);
  CVmHashTable::enum_hash_matches(in_R9,hash_00,in_RCX,in_RSI);
  return;
}

Assistant:

void CVmObjDict::enum_word_props(VMG_
                                 void (*cb_func)(VMG_ void *, vm_prop_id_t,
                                                 const vm_val_t *),
                                 void *cb_ctx, const vm_val_t *strval,
                                 const char *strp, size_t strl)
{
    enum_word_props_ctx ctx;
    unsigned int hash;

    /* set up the enumeration callback context */
    ctx.strval = strval;
    ctx.strp = strp;
    ctx.strl = strl;
    ctx.cb_func = cb_func;
    ctx.cb_ctx = cb_ctx;
    ctx.globals = VMGLOB_ADDR;
    ctx.dict = this;

    /* calculate the hash code */
    hash = calc_str_hash(vmg_ strval, strp, strl);

    /* enumerate the matches */
    get_ext()->hashtab_->enum_hash_matches(hash, &enum_word_props_cb, &ctx);
}